

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_18860d::LogisimParser::parse_xml(LogisimParser *this)

{
  bool bVar1;
  xml_node *pxVar2;
  ModelCircuitLibrary *this_00;
  xml_attribute local_a8;
  char *local_a0;
  char_t *main_circuit;
  xml_node main_node;
  xml_node circuit_node;
  xml_named_node_iterator __end1;
  xml_named_node_iterator __begin1;
  xml_object_range<pugi::xml_named_node_iterator> *__range1;
  xml_node project_node;
  LogisimParser *this_local;
  
  project_node._root = (xml_node_struct *)this;
  __range1 = (xml_object_range<pugi::xml_named_node_iterator> *)
             pugi::xml_node::child(&this->m_xml_doc->super_xml_node,"project");
  bVar1 = pugi::xml_node::operator!((xml_node *)&__range1);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pugi::xml_node::children
              ((xml_object_range<pugi::xml_named_node_iterator> *)&__begin1._name,
               (xml_node *)&__range1,"circuit");
    pugi::xml_object_range<pugi::xml_named_node_iterator>::begin
              ((xml_named_node_iterator *)&__end1._name,
               (xml_object_range<pugi::xml_named_node_iterator> *)&__begin1._name);
    pugi::xml_object_range<pugi::xml_named_node_iterator>::end
              ((xml_named_node_iterator *)&circuit_node,
               (xml_object_range<pugi::xml_named_node_iterator> *)&__begin1._name);
    while( true ) {
      bVar1 = pugi::xml_named_node_iterator::operator!=
                        ((xml_named_node_iterator *)&__end1._name,
                         (xml_named_node_iterator *)&circuit_node);
      if (!bVar1) break;
      pxVar2 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)&__end1._name);
      main_node._root = pxVar2->_root;
      parse_circuit(this,&main_node);
      pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&__end1._name);
    }
    main_circuit = (char_t *)pugi::xml_node::child((xml_node *)&__range1,"main");
    bVar1 = pugi::xml_node::operator!((xml_node *)&main_circuit);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_a8 = pugi::xml_node::attribute((xml_node *)&main_circuit,"name");
      local_a0 = pugi::xml_attribute::value(&local_a8);
      this_00 = lsim::LSimContext::user_library(this->m_lsim_context);
      lsim::ModelCircuitLibrary::change_main_circuit(this_00,local_a0);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LogisimParser::parse_xml() {

    auto project_node = m_xml_doc->child("project");
    if (!project_node) {
        return false;
    }

    /* iterate all circuits */
    for (auto circuit_node : project_node.children("circuit")) {
        parse_circuit(circuit_node);
    }

    /* get main circuit */
    auto main_node = project_node.child("main");
    if (!main_node) {
        return false;
    }

    auto main_circuit = main_node.attribute("name").value();
    m_lsim_context->user_library()->change_main_circuit(main_circuit);
    return true;
}